

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

String * __thiscall Bstrlib::String::operator+=(String *this,uint64 c)

{
  String local_20;
  
  Print((char *)&local_20,"%llu",c);
  operator+=(this,&local_20);
  if (local_20.super_tagbstring.data != (uchar *)0x0) {
    free(local_20.super_tagbstring.data);
  }
  return this;
}

Assistant:

const String& String::operator +=(const uint64 c)
    {
#ifndef HasFloatParsing
        char buffer[21] = { 0 };
        Strings::ulltoa(c, buffer, 10);
        return *this += buffer;
#else
        return *this += String::Print(PF_LLU, c);
#endif
    }